

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O2

QSet<QWidget_*> * __thiscall QSet<QWidget_*>::unite(QSet<QWidget_*> *this,QSet<QWidget_*> *other)

{
  Data *pDVar1;
  Data *pDVar2;
  Span *pSVar3;
  QSet<QWidget_*> *pQVar4;
  ulong uVar5;
  size_t sVar6;
  long in_FS_OFFSET;
  piter local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (other->q_hash).d;
  if ((pDVar1 != (Data *)0x0) &&
     ((uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i < 2)) {
    pDVar2 = (this->q_hash).d;
    if (pDVar2 == (Data *)0x0) {
      sVar6 = 0;
    }
    else {
      sVar6 = pDVar2->size;
    }
    if ((long)sVar6 < (long)pDVar1->size) {
      (this->q_hash).d = pDVar1;
      (other->q_hash).d = pDVar2;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
        local_28 = (piter)QHash<QWidget_*,_QHashDummyValue>::begin(&other->q_hash);
        while( true ) {
          if (local_28.d == (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0 &&
              local_28.bucket == 0) break;
          pSVar3 = (local_28.d)->spans;
          uVar5 = local_28.bucket >> 7;
          QSet<QWidget*>::_emplace_or_overwrite<QWidget*const&>
                    ((QSet<QWidget*> *)this,
                     (QWidget **)
                     (pSVar3[uVar5].entries + pSVar3[uVar5].offsets[(uint)local_28.bucket & 0x7f]));
          QHashPrivate::iterator<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_>::operator++
                    (&local_28);
        }
      }
      else {
        local_28 = (piter)QHash<QWidget_*,_QHashDummyValue>::begin(&other->q_hash);
        while( true ) {
          if (local_28.d == (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0 &&
              local_28.bucket == 0) break;
          pSVar3 = (local_28.d)->spans;
          uVar5 = local_28.bucket >> 7;
          QSet<QWidget*>::_emplace_or_overwrite<QWidget*const>
                    ((QSet<QWidget*> *)this,
                     (QWidget **)
                     (pSVar3[uVar5].entries + pSVar3[uVar5].offsets[(uint)local_28.bucket & 0x7f]));
          QHashPrivate::iterator<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_>::operator++
                    (&local_28);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return this;
      }
      goto LAB_003d3e11;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    pQVar4 = unite(this,other);
    return pQVar4;
  }
LAB_003d3e11:
  __stack_chk_fail();
}

Assistant:

Q_INLINE_TEMPLATE auto QSet<T>::unite(QSet &&other) -> QSet&
{
    if (other.isDetached() && size() < other.size()) {

        // We can change the state of `other`, so take the smaller *this and
        // insert it into the larger `other`, making sure we take equivalent
        // elements from *this:

        swap(other);

        // Now: iterate over `other`, insert into *this, making sure we take
        //      equivalent elements from `other`:

        if (other.isDetached()) { // can move elements from `other`
            for (auto &e : other)
                _emplace_or_overwrite(std::move(e));
        } else { // need to copy elements from `other`
            for (const auto &e : std::as_const(other))
                _emplace_or_overwrite(e);
        }

        return *this;
    }

    // in all other cases, the lvalue overload is not worse:
    return unite(other);
}